

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O3

Aig_Obj_t * driverToPoNew(Aig_Man_t *pAig,Aig_Obj_t *pObjPo)

{
  Aig_Obj_t *pAVar1;
  
  if ((*(uint *)&pObjPo->field_0x18 & 7) != 3) {
    __assert_fail("Aig_ObjIsCo(pObjPo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/arenaViolation.c"
                  ,0x72,"Aig_Obj_t *driverToPoNew(Aig_Man_t *, Aig_Obj_t *)");
  }
  pAVar1 = pObjPo->pFanin0;
  if ((*(uint *)&pAVar1->field_0x18 & 7) != 3) {
    if (((ulong)pAVar1 & 1) == 0) {
      pAVar1 = (Aig_Obj_t *)(pAVar1->field_5).pData;
    }
    else {
      pAVar1 = (Aig_Obj_t *)(*(ulong *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x28) ^ 1);
    }
    return pAVar1;
  }
  __assert_fail("!Aig_ObjIsCo(poDriverOld)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/arenaViolation.c"
                ,0x74,"Aig_Obj_t *driverToPoNew(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

Aig_Obj_t *driverToPoNew( Aig_Man_t *pAig, Aig_Obj_t *pObjPo )
{
    Aig_Obj_t *poDriverOld;
    Aig_Obj_t *poDriverNew;    
    
    //Aig_ObjPrint( pAig, pObjPo );
    //printf("\n");

    assert( Aig_ObjIsCo(pObjPo) );
    poDriverOld = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
    assert( !Aig_ObjIsCo(poDriverOld) );
    poDriverNew = !Aig_IsComplement(poDriverOld)? 
            (Aig_Obj_t *)(Aig_Regular(poDriverOld)->pData) : 
            Aig_Not((Aig_Obj_t *)(Aig_Regular(poDriverOld)->pData));
    //assert( !Aig_ObjIsCo(poDriverNew) );
    return poDriverNew;
}